

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

uint64_t bn_is_zero_mask4(uint64_t *f)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t res;
  uint64_t mask1;
  uint64_t uu____0_3;
  uint64_t uu____0_2;
  uint64_t uu____0_1;
  uint64_t uu____0;
  uint32_t i;
  uint64_t mask;
  uint64_t bn_zero [4];
  uint64_t *f_local;
  
  memset(&mask,0,0x20);
  uVar1 = FStar_UInt64_eq_mask(*f,mask);
  uVar2 = FStar_UInt64_eq_mask(f[1],bn_zero[0]);
  uVar3 = FStar_UInt64_eq_mask(f[2],bn_zero[1]);
  uVar4 = FStar_UInt64_eq_mask(f[3],bn_zero[2]);
  return uVar4 & uVar3 & uVar2 & uVar1;
}

Assistant:

static inline uint64_t bn_is_zero_mask4(uint64_t *f)
{
  uint64_t bn_zero[4U] = { 0U };
  uint64_t mask = 0xFFFFFFFFFFFFFFFFULL;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t uu____0 = FStar_UInt64_eq_mask(f[i], bn_zero[i]);
    mask = uu____0 & mask;);
  uint64_t mask1 = mask;
  uint64_t res = mask1;
  return res;
}